

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall
ThreadPoolTest_deadlockMultiThread_Test::~ThreadPoolTest_deadlockMultiThread_Test
          (ThreadPoolTest_deadlockMultiThread_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ThreadPoolTest, deadlockMultiThread) {
	std::atomic<size_t> iterations{ 0 };
	thread_pool pool{ 8 };

	repeat (total_iterations) {
		pool.push([&iterations, &pool]() {
			++iterations;

			// Neither of the below should cause a deadlock
			pool.threads();
			pool.active();
		});
	}

	pool.join();
	EXPECT_EQ(iterations, total_iterations);
}